

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

void helper_neon_unzip8_aarch64(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t m0;
  uint64_t d0;
  uint64_t zm;
  uint64_t zd;
  uint64_t *rm;
  uint64_t *rd;
  void *vm_local;
  void *vd_local;
  
  uVar1 = *vd;
  uVar2 = *vm;
  *(ulong *)vm = uVar1 >> 8 & 0xff | (uVar1 >> 0x18 & 0xff) << 8 | (uVar1 >> 0x28 & 0xff) << 0x10 |
                 (uVar1 >> 0x38) << 0x18 | (uVar2 >> 8 & 0xff) << 0x20 |
                 (uVar2 >> 0x18 & 0xff) << 0x28 | (uVar2 >> 0x28 & 0xff) << 0x30 |
                 uVar2 & 0xff00000000000000;
  *(ulong *)vd = uVar1 & 0xff | (uVar1 >> 0x10 & 0xff) << 8 | (uVar1 >> 0x20 & 0xff) << 0x10 |
                 (uVar1 >> 0x30 & 0xff) << 0x18 | (uVar2 & 0xff) << 0x20 |
                 (uVar2 >> 0x10 & 0xff) << 0x28 | (uVar2 >> 0x20 & 0xff) << 0x30 |
                 (uVar2 >> 0x30) << 0x38;
  return;
}

Assistant:

void HELPER(neon_unzip8)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd = rd[0], zm = rm[0];

    uint64_t d0 = ELEM(zd, 0, 8) | (ELEM(zd, 2, 8) << 8)
        | (ELEM(zd, 4, 8) << 16) | (ELEM(zd, 6, 8) << 24)
        | (ELEM(zm, 0, 8) << 32) | (ELEM(zm, 2, 8) << 40)
        | (ELEM(zm, 4, 8) << 48) | (ELEM(zm, 6, 8) << 56);
    uint64_t m0 = ELEM(zd, 1, 8) | (ELEM(zd, 3, 8) << 8)
        | (ELEM(zd, 5, 8) << 16) | (ELEM(zd, 7, 8) << 24)
        | (ELEM(zm, 1, 8) << 32) | (ELEM(zm, 3, 8) << 40)
        | (ELEM(zm, 5, 8) << 48) | (ELEM(zm, 7, 8) << 56);

    rm[0] = m0;
    rd[0] = d0;
}